

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

int session_get_outgoing_window(SESSION_HANDLE session,uint32_t *outgoing_window)

{
  int iVar1;
  
  iVar1 = 0x411;
  if (outgoing_window != (uint32_t *)0x0 && session != (SESSION_HANDLE)0x0) {
    *outgoing_window = session->outgoing_window;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int session_get_outgoing_window(SESSION_HANDLE session, uint32_t* outgoing_window)
{
    int result;

    if ((session == NULL) ||
        (outgoing_window == NULL))
    {
        result = MU_FAILURE;
    }
    else
    {
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)session;

        *outgoing_window = session_instance->outgoing_window;

        result = 0;
    }

    return result;
}